

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItAFunction<ThreeWiseHash<unsigned_int,unsigned_char>>(uint L)

{
  uchar uVar1;
  uint uVar2;
  uint32 uVar3;
  ostream *poVar4;
  ulong uVar5;
  _Elt_pointer puVar6;
  uchar *puVar7;
  uchar inchar;
  uint j;
  int iVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  _Map_pointer ppuVar13;
  bool bVar14;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  uchar local_18a1;
  uint32 local_18a0;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1898;
  uint local_1844;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_1840;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar8 = 3;
  ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_1840,3,L);
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_last = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_cur = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_start._M_first = (uchar *)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1898._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1898,0);
  do {
    local_18a0 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_18a0);
    local_18a1 = (char)uVar3 + 'A';
    if (local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1898,&local_18a1);
    }
    else {
      *local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = local_18a1;
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    ThreeWiseHash<unsigned_int,_unsigned_char>::eat(&local_1840,local_18a1);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  uVar5 = 0;
  uVar12 = 0;
  while( true ) {
    uVar1 = *local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1844 = (uint)uVar5;
    if (local_1898._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1898._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1898._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1898._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1898._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1898._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_18a0 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_18a0);
    inchar = (char)uVar3 + 'A';
    local_18a0 = CONCAT71(local_18a0._1_7_,inchar);
    if (local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1898._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898,
                 (uchar *)&local_18a0);
    }
    else {
      *local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur = inchar;
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    ThreeWiseHash<unsigned_int,_unsigned_char>::update(&local_1840,uVar1,inchar);
    uVar2 = ThreeWiseHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((ThreeWiseHash<unsigned_int,unsigned_char> *)&local_1840,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898);
    if (uVar2 != local_1840.hashvalue) break;
    bVar14 = 0x1869e < uVar12;
    uVar12 = uVar12 + 1;
    uVar5 = CONCAT71((int7)(uVar3 >> 8),bVar14);
    if (uVar12 == 100000) goto LAB_00106900;
  }
  puVar9 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar13 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_1898._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      local_18a0 = CONCAT71(local_18a0._1_7_,*puVar9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_18a0,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      puVar9 = puVar9 + 1;
      if (puVar9 == puVar7) {
        puVar9 = ppuVar13[1];
        ppuVar13 = ppuVar13 + 1;
        puVar7 = puVar9 + 0x200;
      }
    } while (puVar9 != local_1898._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bug",3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  uVar5 = (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
          (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first;
  puVar6 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (0x1ff < uVar5) {
    uVar11 = uVar5 >> 9 | 0xff80000000000000;
    if (0 < (long)uVar5) {
      uVar11 = uVar5 >> 9;
    }
    puVar6 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
             uVar5 + uVar11 * -0x200;
  }
  local_18a0._0_1_ = *puVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_18a0,1);
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
           (1 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
  if (puVar7 < (uchar *)0x200) {
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  }
  else {
    uVar5 = (ulong)puVar7 >> 9 | 0xff80000000000000;
    if (-1 < (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar5 = (ulong)puVar7 >> 9;
    }
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(puVar7 + uVar5 * -0x200);
  }
  local_18a0._0_1_ = *puVar7;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_18a0,1);
  puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
           (2 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
  if (puVar7 < (uchar *)0x200) {
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur + 2;
  }
  else {
    uVar5 = (ulong)puVar7 >> 9 | 0xff80000000000000;
    if (-2 < (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar5 = (ulong)puVar7 >> 9;
    }
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(puVar7 + uVar5 * -0x200);
  }
  local_18a0 = CONCAT71(local_18a0._1_7_,*puVar7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_18a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," was hashed to ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," when true hash value is ",0x19);
  ThreeWiseHash<unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((ThreeWiseHash<unsigned_int,unsigned_char> *)&local_1840,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1898);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar10 = 0;
  do {
    puVar7 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
             (lVar10 - (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first);
    puVar9 = local_1898._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((uchar *)0x1ff < puVar7) {
      uVar5 = (ulong)puVar7 >> 9 | 0xff80000000000000;
      if (0 < (long)puVar7) {
        uVar5 = (ulong)puVar7 >> 9;
      }
      puVar9 = local_1898._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
               (long)(local_1898._M_impl.super__Deque_impl_data._M_start._M_cur +
                     (uVar5 * -0x200 -
                     (long)local_1898._M_impl.super__Deque_impl_data._M_start._M_first));
    }
    local_18a0 = CONCAT71(local_18a0._1_7_,puVar9[lVar10]);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_18a0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  uVar5 = (ulong)local_1844;
LAB_00106900:
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1898);
  if (local_1840.hashers.
      super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1840.hashers.
                    super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&local_1840.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (bool)((byte)uVar5 & 1);
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}